

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.h
# Opt level: O1

void EncodeFrameSBG(uchar *frame,int *pframelen,uchar mid,uchar mclass,uchar *payload,int len)

{
  uint uVar1;
  ushort uVar2;
  ulong uVar3;
  undefined2 uVar4;
  uint uVar5;
  char cVar6;
  uint uVar7;
  size_t __n;
  
  frame[0] = 0xff;
  frame[1] = 'Z';
  frame[2] = mid;
  frame[3] = mclass;
  frame[4] = (uchar)len;
  frame[5] = (uchar)((uint)len >> 8);
  __n = (size_t)len;
  memcpy(frame + 6,payload,__n);
  uVar2 = (short)len + 4;
  if (uVar2 == 0) {
    uVar4 = 0;
  }
  else {
    uVar3 = 0;
    uVar5 = 0;
    do {
      uVar5 = uVar5 ^ frame[uVar3 + 2];
      cVar6 = '\b';
      do {
        uVar7 = (uVar5 & 0xffff) >> 1;
        uVar1 = uVar5 & 1;
        uVar5 = uVar7 ^ 0xffff8408;
        if (uVar1 == 0) {
          uVar5 = uVar7;
        }
        uVar4 = (undefined2)uVar5;
        cVar6 = cVar6 + -1;
      } while (cVar6 != '\0');
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar2);
  }
  *(undefined2 *)(frame + __n + 6) = uVar4;
  frame[__n + 8] = '3';
  *pframelen = len + 9;
  return;
}

Assistant:

inline void EncodeFrameSBG(unsigned char* frame, int* pframelen, unsigned char mid, unsigned char mclass, unsigned char* payload, int len)
{
	int offset = 0;
	uint16 crc = 0;

	frame[0] = (unsigned char)SYNC1_SBG;
	frame[1] = (unsigned char)SYNC2_SBG;
	frame[2] = (unsigned char)mid;
	frame[3] = (unsigned char)mclass;
	frame[4] = (unsigned char)(len&0xFF);
	frame[5] = (unsigned char)(len>>8);
	offset = FRAME_HEADER_LEN_SBG;
	memcpy(frame+offset, payload, len);
	offset += len;
	crc = CalcCRCSBG(frame+2, (uint16)(offset-2));
	frame[offset] = (unsigned char)(crc&0xFF);
	offset++;
	frame[offset] = (unsigned char)(crc>>8);
	offset++;
	frame[offset] = (unsigned char)ETX_SBG;
	*pframelen = len+MIN_FRAME_LEN_SBG;
}